

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpDecoderImpl::read_rle8_data(BmpDecoderImpl *this)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint j;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  
  uVar1 = (this->grayscale ^ 1) * 2 + 1;
  uVar17 = (ulong)uVar1;
  iVar2 = (this->info_header).width;
  uVar14 = uVar1 * iVar2;
  uVar9 = (ulong)((this->info_header).height * uVar14);
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::resize(&(this->pixels).super_void_vector_base,uVar9);
  pvVar3 = (this->pixels).super_void_vector_base.m_data;
  lVar13 = (long)pvVar3 + (uVar9 - uVar14);
  memset(pvVar3,0,uVar9);
  do {
    iVar12 = 0;
    while( true ) {
      while( true ) {
        iVar4 = std::istream::get();
        uVar5 = std::istream::get();
        if (iVar4 == 0) break;
        iVar7 = 0;
        iVar6 = 0;
        if (0 < iVar4) {
          iVar6 = iVar4;
        }
        for (; iVar7 != iVar6; iVar7 = iVar7 + 1) {
          pvVar3 = (this->map).super_void_vector_base.m_data;
          for (uVar9 = 0; uVar17 != uVar9; uVar9 = uVar9 + 1) {
            *(undefined1 *)(lVar13 + uVar9) =
                 *(undefined1 *)((long)pvVar3 + uVar9 + (long)(int)(uVar5 * 3));
          }
          lVar13 = lVar13 + uVar17;
        }
        iVar12 = iVar4 + iVar12;
      }
      if (uVar5 == 0) break;
      if (uVar5 == 1) {
        return;
      }
      if (uVar5 == 2) {
        lVar16 = -(ulong)((iVar2 + iVar12) * uVar1);
        if (iVar12 == (this->info_header).width) {
          iVar12 = 0;
        }
        else {
          lVar16 = 0;
        }
        iVar6 = std::istream::get();
        iVar7 = std::istream::get();
        iVar6 = iVar6 + iVar12;
        iVar4 = (this->info_header).width;
        if (iVar4 < iVar6) {
          iVar8 = iVar6 / iVar4;
          iVar6 = iVar6 % iVar4;
          iVar7 = iVar7 + iVar8 + 1;
        }
        lVar10 = 0;
        if (iVar7 != 0) {
          lVar10 = -(ulong)(iVar7 * uVar14);
        }
        lVar13 = lVar10 + lVar13 + lVar16 + (ulong)((iVar6 - iVar12) * uVar1);
        iVar12 = iVar6;
      }
      else {
        uVar11 = 0;
        uVar15 = uVar5;
        if ((int)uVar5 < 1) {
          uVar15 = 0;
          uVar11 = 0;
        }
        for (; uVar11 != uVar15; uVar11 = uVar11 + 1) {
          iVar4 = std::istream::get();
          pvVar3 = (this->map).super_void_vector_base.m_data;
          for (uVar9 = 0; uVar17 != uVar9; uVar9 = uVar9 + 1) {
            *(undefined1 *)(lVar13 + uVar9) =
                 *(undefined1 *)((long)pvVar3 + uVar9 + (long)(iVar4 * 3));
          }
          lVar13 = lVar13 + uVar17;
        }
        if ((uVar5 & 1) != 0) {
          std::istream::get();
        }
      }
    }
    lVar13 = lVar13 - (ulong)((iVar12 + iVar2) * uVar1);
  } while( true );
}

Assistant:

void BmpDecoderImpl::read_rle8_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg (file_header.offset, std::ios::beg);

    // make room for the pixels
    pixels.resize (image_size);

    // setup the base pointer at the beginning of the last line.
    UInt8 * base = pixels.data() + image_size - line_size;
    UInt8 * mover = base;

    // set the image's background color to black.
    VIGRA_CSTD::memset (pixels.data (), 0, image_size);

    // read the rle codes one by one.
    int c1, c2;
    bool painting = true;

    int x = 0;

    while (painting) {

        c1 = stream.get ();
        c2 = stream.get ();

        if (c1 == 0x00) {

            // escape sequences
            switch (c2) {
            case 0x00:
                {
                    // end of line

                    // finished painting this line, move the pointer to
                    // the beginning of the previous line, which is the
                    // next bmp line.
                    // we need to go back to the beginning of this line,
                    // and another additional line back.
                    mover -= line_size + ncomp*x;

                    // so we are at the beginning of the next bmp line.
                    x = 0;

                    break;
                }
            case 0x01:
                {
                    // end of bitmap
                    painting = false;
                    break;
                }
            case 0x02:
                {
                    // "delta" movement

                    // handle the end-of-line case.
                    if (x == info_header.width) {
                        mover -= line_size + ncomp*x;
                        x = 0;
                    }

                    unsigned int dx = stream.get ();
                    unsigned int dy = stream.get ();
                    int nx = x + dx;

                    // x movement.
                    if (nx > info_header.width) {
                        dy += nx / info_header.width + 1;
                        nx %= info_header.width;
                    }
                    mover += ncomp*(nx-x);
                    x = nx;

                    // y movement.
                    if (dy != 0) {
                        mover -= line_size*dy;
                    }
                    break;
                }
            default:

                // absolute mode. paint the following c2 bytes.
                // then, eventually skip one byte to respect 16 bit boundaries.
                for (int k = 0; k < c2; ++k) {
                    const int c = stream.get ();
                    const UInt8 *map_base = map.data () + 3*c;
                    for (unsigned int j = 0; j < ncomp; ++j)
                        mover [j] = map_base [j];
                    mover += ncomp;
                }
                if (c2 % 2)
                    stream.get ();
            }

        } else {

            // plain rle: repeat c2 mapped, c1 times.
            // a line break may not happen here.
            for (int i = 0; i < c1; ++i) {
                const UInt8 *map_base = map.data () + 3*c2;
                for (unsigned int j = 0; j < ncomp; ++j)
                    mover [j] = map_base [j];
                mover += ncomp;
            }
            x += c1;
        }
    }
}